

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O1

bool __thiscall
draco::SequentialIntegerAttributeDecoder::DecodeIntegerValues
          (SequentialIntegerAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  long lVar1;
  byte bVar2;
  PointAttribute *pPVar3;
  __uniq_ptr_data<draco::DataBuffer,_std::default_delete<draco::DataBuffer>,_true,_true> _Var4;
  PredictionSchemeTypedDecoderInterface<int,_int> *pPVar5;
  bool bVar6;
  char cVar7;
  uint num_components;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint32_t *out_values;
  long lVar11;
  ulong uVar12;
  
  num_components =
       (*(this->super_SequentialAttributeDecoder)._vptr_SequentialAttributeDecoder[0xb])();
  if (0 < (int)num_components) {
    lVar11 = (long)(point_ids->
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(point_ids->
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 2;
    PreparePortableAttribute(this,(int)lVar11,num_components);
    pPVar3 = (this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
             .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
    if (pPVar3->num_unique_entries_ == 0) {
      out_values = (uint32_t *)0x0;
    }
    else {
      out_values = (uint32_t *)
                   (*(long *)(pPVar3->super_GeometryAttribute).buffer_ +
                   (pPVar3->super_GeometryAttribute).byte_offset_);
    }
    if (out_values != (uint32_t *)0x0) {
      lVar1 = in_buffer->pos_ + 1;
      if (lVar1 <= in_buffer->data_size_) {
        cVar7 = in_buffer->data_[in_buffer->pos_];
        in_buffer->pos_ = lVar1;
        uVar12 = lVar11 * (ulong)num_components;
        if (cVar7 == '\0') {
          lVar11 = in_buffer->pos_ + 1;
          if (in_buffer->data_size_ < lVar11) {
            return false;
          }
          bVar2 = in_buffer->data_[in_buffer->pos_];
          uVar10 = (ulong)bVar2;
          in_buffer->pos_ = lVar11;
          uVar8 = DataTypeLength(DT_INT32);
          _Var4.super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>.
          _M_t.super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
          super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl =
               (((this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)->
               attribute_buffer_)._M_t.
               super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>;
          uVar9 = *(long *)((long)_Var4.
                                  super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                  .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl +
                           8) -
                  *(long *)_Var4.
                           super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                           .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl;
          if (uVar8 == bVar2) {
            uVar10 = uVar12 * 4;
            if (uVar9 < uVar10) {
              return false;
            }
            if (in_buffer->data_size_ < (long)(in_buffer->pos_ + uVar10)) {
              return false;
            }
            memcpy(out_values,in_buffer->data_ + in_buffer->pos_,uVar10);
            in_buffer->pos_ = in_buffer->pos_ + uVar10;
          }
          else {
            if (uVar9 < uVar12 * uVar10) {
              return false;
            }
            if (in_buffer->data_size_ - in_buffer->pos_ < (long)(uVar12 * uVar10)) {
              return false;
            }
            if (uVar12 != 0) {
              lVar11 = 0;
              do {
                if (in_buffer->data_size_ < (long)(in_buffer->pos_ + uVar10)) {
                  return false;
                }
                memcpy(out_values + lVar11,in_buffer->data_ + in_buffer->pos_,uVar10);
                in_buffer->pos_ = in_buffer->pos_ + uVar10;
                lVar11 = lVar11 + 1;
              } while (uVar12 - lVar11 != 0);
            }
          }
        }
        else {
          bVar6 = DecodeSymbols((uint32_t)uVar12,num_components,in_buffer,out_values);
          if (!bVar6) {
            return false;
          }
        }
        if ((uVar12 != 0) &&
           ((pPVar5 = (this->prediction_scheme_)._M_t.
                      super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                      .
                      super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>
                      ._M_head_impl,
            pPVar5 == (PredictionSchemeTypedDecoderInterface<int,_int> *)0x0 ||
            (cVar7 = (**(code **)((long)(pPVar5->super_PredictionSchemeDecoderInterface).
                                        super_PredictionSchemeInterface + 0x40))(), cVar7 == '\0')))
           ) {
          ConvertSymbolsToSignedInts(out_values,(uint32_t)uVar12,(int32_t *)out_values);
        }
        pPVar5 = (this->prediction_scheme_)._M_t.
                 super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                 .
                 super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>
                 ._M_head_impl;
        if ((pPVar5 == (PredictionSchemeTypedDecoderInterface<int,_int> *)0x0) ||
           ((cVar7 = (**(code **)((long)(pPVar5->super_PredictionSchemeDecoderInterface).
                                        super_PredictionSchemeInterface + 0x50))(pPVar5,in_buffer),
            cVar7 != '\0' &&
            ((uVar12 == 0 ||
             (pPVar5 = (this->prediction_scheme_)._M_t.
                       super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                       .
                       super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>
                       ._M_head_impl,
             cVar7 = (**(code **)((long)(pPVar5->super_PredictionSchemeDecoderInterface).
                                        super_PredictionSchemeInterface + 0x58))
                               (pPVar5,out_values,out_values,uVar12 & 0xffffffff,num_components,
                                (point_ids->
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start), cVar7 != '\0')))))) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool SequentialIntegerAttributeDecoder::DecodeIntegerValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  const int num_components = GetNumValueComponents();
  if (num_components <= 0) {
    return false;
  }
  const size_t num_entries = point_ids.size();
  const size_t num_values = num_entries * num_components;
  PreparePortableAttribute(static_cast<int>(num_entries), num_components);
  int32_t *const portable_attribute_data = GetPortableAttributeData();
  if (portable_attribute_data == nullptr) {
    return false;
  }
  uint8_t compressed;
  if (!in_buffer->Decode(&compressed)) {
    return false;
  }
  if (compressed > 0) {
    // Decode compressed values.
    if (!DecodeSymbols(static_cast<uint32_t>(num_values), num_components,
                       in_buffer,
                       reinterpret_cast<uint32_t *>(portable_attribute_data))) {
      return false;
    }
  } else {
    // Decode the integer data directly.
    // Get the number of bytes for a given entry.
    uint8_t num_bytes;
    if (!in_buffer->Decode(&num_bytes)) {
      return false;
    }
    if (num_bytes == DataTypeLength(DT_INT32)) {
      if (portable_attribute()->buffer()->data_size() <
          sizeof(int32_t) * num_values) {
        return false;
      }
      if (!in_buffer->Decode(portable_attribute_data,
                             sizeof(int32_t) * num_values)) {
        return false;
      }
    } else {
      if (portable_attribute()->buffer()->data_size() <
          num_bytes * num_values) {
        return false;
      }
      if (in_buffer->remaining_size() <
          static_cast<int64_t>(num_bytes) * static_cast<int64_t>(num_values)) {
        return false;
      }
      for (size_t i = 0; i < num_values; ++i) {
        if (!in_buffer->Decode(portable_attribute_data + i, num_bytes)) {
          return false;
        }
      }
    }
  }

  if (num_values > 0 && (prediction_scheme_ == nullptr ||
                         !prediction_scheme_->AreCorrectionsPositive())) {
    // Convert the values back to the original signed format.
    ConvertSymbolsToSignedInts(
        reinterpret_cast<const uint32_t *>(portable_attribute_data),
        static_cast<int>(num_values), portable_attribute_data);
  }

  // If the data was encoded with a prediction scheme, we must revert it.
  if (prediction_scheme_) {
    if (!prediction_scheme_->DecodePredictionData(in_buffer)) {
      return false;
    }

    if (num_values > 0) {
      if (!prediction_scheme_->ComputeOriginalValues(
              portable_attribute_data, portable_attribute_data,
              static_cast<int>(num_values), num_components, point_ids.data())) {
        return false;
      }
    }
  }
  return true;
}